

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Id __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::convertGlslangToSpvType
          (TGlslangToSpvTraverser *this,TType *type,bool forwardReferenceOnly)

{
  int iVar1;
  uint uVar2;
  Id IVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined7 in_register_00000011;
  TLayoutPacking TVar4;
  TLayoutPacking TVar5;
  
  iVar1 = (*type->_vptr_TType[7])(type,type,CONCAT71(in_register_00000011,forwardReferenceOnly));
  TVar4 = ElpNone;
  TVar5 = ElpNone;
  if (iVar1 == 0x10) {
    iVar1 = (*type->_vptr_TType[0xb])(type);
    TVar5 = TVar4;
    if ((*(uint *)(CONCAT44(extraout_var,iVar1) + 8) & 0x7f) != 5) {
      iVar1 = (*type->_vptr_TType[0xb])(type);
      if ((*(uint *)(CONCAT44(extraout_var_00,iVar1) + 8) & 0x7f) != 6) {
        iVar1 = (*type->_vptr_TType[0xb])(type);
        if ((*(uint *)(CONCAT44(extraout_var_01,iVar1) + 8) & 0x7f) != 7) {
          iVar1 = (*type->_vptr_TType[0xb])(type);
          if ((*(byte *)(CONCAT44(extraout_var_02,iVar1) + 0xd) & 8) == 0) goto LAB_003ba020;
        }
      }
    }
    iVar1 = (*type->_vptr_TType[0xb])(type);
    uVar2 = *(byte *)(CONCAT44(extraout_var_03,iVar1) + 0x10) & 0xf;
    if ((uVar2 < 6) && ((0x2cU >> uVar2 & 1) != 0)) {
      iVar1 = (*type->_vptr_TType[0xb])(type);
      TVar5 = *(byte *)(CONCAT44(extraout_var_04,iVar1) + 0x10) & 0xf;
    }
  }
LAB_003ba020:
  iVar1 = (*type->_vptr_TType[0xb])(type);
  IVar3 = convertGlslangToSpvType
                    (this,type,TVar5,(TQualifier *)CONCAT44(extraout_var_05,iVar1),false,false);
  return IVar3;
}

Assistant:

spv::Id TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType& type, bool forwardReferenceOnly)
{
    return convertGlslangToSpvType(type, getExplicitLayout(type), type.getQualifier(), false, forwardReferenceOnly);
}